

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

CallbackResult __thiscall EntryBTree::traverseCallback(EntryBTree *this,uint8_t *data)

{
  uint8_t *puVar1;
  ostream *poVar2;
  KeyType obj;
  KeyType local_20;
  
  local_20.m_flags = 0;
  local_20.m_nameIndex = 0xffffffff;
  local_20.m_extIndex = 0xffffffff;
  local_20.m_linkIndex = 0xffffffff;
  puVar1 = parseData(this,&local_20,data);
  if (puVar1 == (uint8_t *)0x0) {
    poVar2 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot parse Entry object.",0x1a);
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return CONTINUE;
}

Assistant:

EntryBTree::CallbackResult EntryBTree::traverseCallback(const uint8_t* data) const
{
	CallbackResult result = CallbackResult::CONTINUE;

	KeyType obj;
	if (parseData(obj, data)) {
		std::cout << obj.nameIndex() << ":" << obj.extIndex() << ":" << obj.linkIndex() << std::endl;
	} else {
		std::cerr << "Cannot parse Entry object." << std::endl;
	}

	return result;
}